

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O1

void __thiscall ParserTest::~ParserTest(ParserTest *this)

{
  pointer ppNVar1;
  pointer ppEVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ParserTest_001d8188;
  (this->fs_).super_DiskInterface.super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__VirtualFileSystem_001d87a0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->fs_).files_created_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->fs_).files_removed_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
  ::~_Rb_tree(&(this->fs_).files_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->fs_).files_read_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->fs_).directories_made_);
  ppNVar1 = (this->state).defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)(this->state).defaults_.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppNVar1);
  }
  (this->state).bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&(this->state).bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->state).bindings_.bindings_._M_t);
  ppEVar2 = (this->state).edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->state).edges_.
                                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppEVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&(this->state).pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->state);
  return;
}

Assistant:

void AssertParse(const char* input) {
    ManifestParser parser(&state, &fs_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
    VerifyGraph(state);
  }